

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::GetBlock
          (TPZBlockDiagonal<std::complex<double>_> *this,int64_t i,
          TPZFMatrix<std::complex<double>_> *block)

{
  long *plVar1;
  int *piVar2;
  long row;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  long *in_RDX;
  int64_t in_RSI;
  long in_RDI;
  int64_t c;
  int64_t r;
  int64_t bsize;
  int64_t firstpos;
  long local_38;
  long col;
  TPZFMatrix<std::complex<double>_> *this_00;
  
  plVar1 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),in_RSI);
  this_00 = (TPZFMatrix<std::complex<double>_> *)*plVar1;
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),in_RSI);
  row = (long)*piVar2;
  (**(code **)(*in_RDX + 0x70))(in_RDX,row,row);
  for (col = 0; col < row; col = col + 1) {
    for (local_38 = 0; local_38 < row; local_38 = local_38 + 1) {
      pcVar3 = TPZVec<std::complex<double>_>::operator[]
                         ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                          (long)&((TPZFMatrix<std::complex<double>_> *)
                                 (&((TPZFMatrix<std::complex<double>_> *)
                                   (&((TPZFMatrix<std::complex<double>_> *)(&this_00->fPivot + -1))
                                     ->fPivot + -1))->fPivot + -1))->fPivot +
                          row * local_38 + col + 0xffffffffffffffc8U);
      pcVar4 = TPZFMatrix<std::complex<double>_>::operator()(this_00,row,col);
      *(undefined8 *)pcVar4->_M_value = *(undefined8 *)pcVar3->_M_value;
      *(undefined8 *)(pcVar4->_M_value + 8) = *(undefined8 *)(pcVar3->_M_value + 8);
    }
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::GetBlock(int64_t i, TPZFMatrix<TVar> &block){
    int64_t firstpos = fBlockPos[i];
    int64_t bsize = fBlockSize[i];
    block.Redim(bsize,bsize);
    int64_t r,c;
    for(r=0; r<bsize; r++) {
        for(c=0; c<bsize; c++) {
            block(r,c) = fStorage[firstpos+r+bsize*c];
        }
    }
}